

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

GLenum cgltfComponentTypeToGl(cgltf_component_type type)

{
  if (type != cgltf_component_type_invalid) {
    return cgltfComponentTypeToGl::lu[type];
  }
  __assert_fail("type != cgltf_component_type_invalid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.cpp"
                ,0x5f,"GLenum cgltfComponentTypeToGl(cgltf_component_type)");
}

Assistant:

GLenum cgltfComponentTypeToGl(cgltf_component_type type)
{
    assert(type != cgltf_component_type_invalid);
    static const GLenum lu[] = {
        0,
        GL_BYTE,
        GL_UNSIGNED_BYTE,
        GL_SHORT,
        GL_UNSIGNED_SHORT,
        GL_UNSIGNED_INT,
        GL_FLOAT
    };
    return lu[type];
}